

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O1

size_t __thiscall OPNMIDIplay::chooseDevice(OPNMIDIplay *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  iterator iVar3;
  size_t sVar4;
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  size_t local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  value_type local_198;
  MIDIchannel local_170;
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->m_midiDevices)._M_t,name);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->m_midiDevices)._M_t._M_impl.super__Rb_tree_header)
  {
    sVar4 = (this->m_midiDevices)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pcVar2 = (name->_M_dataplus)._M_p;
    local_1b8 = local_1a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b8,pcVar2,pcVar2 + name->_M_string_length);
    local_1e0 = local_1d0;
    std::__cxx11::string::_M_construct<char*>((string *)&local_1e0,local_1b8,local_1b8 + local_1b0);
    sVar4 = sVar4 * 0x10;
    paVar1 = &local_198.first.field_2;
    local_1c0 = sVar4;
    local_198.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_198,local_1e0,local_1e0 + local_1d8);
    local_198.second = local_1c0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_insert_unique(&(this->m_midiDevices)._M_t,&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_198.first._M_dataplus._M_p);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0);
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    MIDIchannel::MIDIchannel(&local_170);
    std::vector<OPNMIDIplay::MIDIchannel,_std::allocator<OPNMIDIplay::MIDIchannel>_>::resize
              (&this->m_midiChannels,sVar4 + 0x10,&local_170);
    if ((local_170.activenotes.cells_allocd_ == true) &&
       (local_170.activenotes.cells_ != (pl_cell<OPNMIDIplay::MIDIchannel::NoteInfo> *)0x0)) {
      operator_delete__(local_170.activenotes.cells_);
    }
    resetMIDIDefaults(this,(int)sVar4);
  }
  else {
    sVar4 = *(size_t *)(iVar3._M_node + 2);
  }
  return sVar4;
}

Assistant:

size_t OPNMIDIplay::chooseDevice(const std::string &name)
{
    std::map<std::string, size_t>::iterator i = m_midiDevices.find(name);

    if(i != m_midiDevices.end())
        return i->second;

    size_t n = m_midiDevices.size() * 16;
    m_midiDevices.insert(std::make_pair(name, n));
    m_midiChannels.resize(n + 16);
    resetMIDIDefaults(static_cast<int>(n));
    return n;
}